

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBSepiaRow_C(uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  uint8_t uVar6;
  uint uVar7;
  
  lVar4 = 0;
  if (width < 1) {
    width = 0;
  }
  for (; width != (int)lVar4; lVar4 = lVar4 + 1) {
    bVar1 = dst_argb[lVar4 * 4];
    bVar2 = dst_argb[lVar4 * 4 + 1];
    bVar3 = dst_argb[lVar4 * 4 + 2];
    uVar7 = (uint)bVar3 * 0x2d + (uint)bVar2 * 0x58 + (uint)bVar1 * 0x16 >> 7;
    uVar5 = (uint)bVar3 * 0x32 + (uint)bVar2 * 0x62 + (uint)bVar1 * 0x18 >> 7;
    dst_argb[lVar4 * 4] =
         (uint8_t)((uint)bVar3 * 0x23 + (uint)bVar2 * 0x44 + (uint)bVar1 * 0x11 >> 7);
    uVar6 = (uint8_t)uVar7;
    if (0xfe < uVar7) {
      uVar6 = 0xff;
    }
    dst_argb[lVar4 * 4 + 1] = uVar6;
    uVar6 = (uint8_t)uVar5;
    if (0xfe < uVar5) {
      uVar6 = 0xff;
    }
    dst_argb[lVar4 * 4 + 2] = uVar6;
  }
  return;
}

Assistant:

void ARGBSepiaRow_C(uint8_t* dst_argb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    int b = dst_argb[0];
    int g = dst_argb[1];
    int r = dst_argb[2];
    int sb = (b * 17 + g * 68 + r * 35) >> 7;
    int sg = (b * 22 + g * 88 + r * 45) >> 7;
    int sr = (b * 24 + g * 98 + r * 50) >> 7;
    // b does not over flow. a is preserved from original.
    dst_argb[0] = sb;
    dst_argb[1] = clamp255(sg);
    dst_argb[2] = clamp255(sr);
    dst_argb += 4;
  }
}